

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O0

void __thiscall LexicalAnalyzer::CutLine(LexicalAnalyzer *this)

{
  ulong uVar1;
  char *pcVar2;
  int local_40;
  int i;
  undefined1 local_30 [8];
  string line;
  LexicalAnalyzer *this_local;
  
  line.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  std::__cxx11::string::operator+=((string *)this,'\n');
  for (local_40 = 0; uVar1 = std::__cxx11::string::size(), (ulong)(long)local_40 < uVar1;
      local_40 = local_40 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
    if (*pcVar2 == '\n') {
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->lines,(value_type *)local_30);
        std::__cxx11::string::clear();
      }
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
      std::__cxx11::string::operator+=((string *)local_30,*pcVar2);
    }
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void LexicalAnalyzer::CutLine() {
    std::string line;
    source += '\n';//Add an '\n' at the end of file
    for (int i = 0; i < source.size(); i++) {
        if (source[i] != '\n') {
            line += source[i];
        } else {
            if (!line.empty()) {
                lines.push_back(line);
                line.clear();
            }
        }
    }
}